

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deadlock_test.cpp
# Opt level: O1

void __thiscall
CheckedSharedMutexTest_TryLockReaderDeadlock_Test<yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>_>
::TestBody(CheckedSharedMutexTest_TryLockReaderDeadlock_Test<yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>_>
           *this)

{
  DeathTest *pDVar1;
  DeathTest *pDVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  char *message;
  StringLike<const_char_*> *regex;
  DeathTest *gtest_dt;
  anon_class_1_0_00000001 test_body;
  DeathTest *local_80;
  anon_class_1_0_00000001 local_71;
  AssertHelper local_70;
  Message local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_48;
  
  bVar3 = testing::internal::AlwaysTrue();
  if (!bVar3) goto LAB_0019f071;
  local_70.data_ = (AssertHelperData *)0x1de0a4;
  testing::ContainsRegex<char_const*>
            ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_68,
             (testing *)&local_70,regex);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&local_48,(PolymorphicMatcher *)&local_68);
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  bVar4 = testing::internal::DeathTest::Create
                    ("test_body()",
                     (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                      *)&local_48,
                     "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/deadlock_test.cpp"
                     ,0x14a,&local_80);
  testing::internal::
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase(&local_48);
  pDVar1 = local_80;
  bVar3 = true;
  if (bVar4) {
    if (local_80 != (DeathTest *)0x0) {
      iVar5 = (*local_80->_vptr_DeathTest[2])(local_80);
      pDVar2 = local_80;
      if (iVar5 == 0) {
        testing::KilledBySignal::KilledBySignal((KilledBySignal *)&local_68,6);
        iVar5 = (*local_80->_vptr_DeathTest[3])();
        bVar3 = testing::KilledBySignal::operator()((KilledBySignal *)&local_68,iVar5);
        iVar5 = (*pDVar2->_vptr_DeathTest[4])(pDVar2,(ulong)bVar3);
        if ((char)iVar5 != '\0') goto LAB_0019f058;
        bVar3 = true;
        bVar4 = false;
      }
      else {
        if (iVar5 == 1) {
          bVar3 = testing::internal::AlwaysTrue();
          if (bVar3) {
            TestBody::anon_class_1_0_00000001::operator()(&local_71);
          }
          (*local_80->_vptr_DeathTest[5])(local_80,2);
          (*pDVar2->_vptr_DeathTest[5])(pDVar2,0);
        }
LAB_0019f058:
        bVar3 = false;
        bVar4 = true;
      }
      (*pDVar1->_vptr_DeathTest[1])(pDVar1);
      if (!bVar4) goto LAB_0019f06d;
    }
    bVar3 = false;
  }
LAB_0019f06d:
  if (!bVar3) {
    return;
  }
LAB_0019f071:
  testing::Message::Message(&local_68);
  message = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_70,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/deadlock_test.cpp"
             ,0x14a,message);
  testing::internal::AssertHelper::operator=(&local_70,&local_68);
  testing::internal::AssertHelper::~AssertHelper(&local_70);
  if (local_68.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_68.ss_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  return;
}

Assistant:

TYPED_TEST(CheckedSharedMutexTest, TryLockReaderDeadlock)
{
  auto test_body = []{
    yamc::test::barrier step(2);
    TypeParam mtx1;
    TypeParam mtx2;
    yamc::test::task_runner(2, [&](std::size_t id) {
      switch (id) {
      case 0:
        ASSERT_TRUE(mtx1.try_lock());
        step.await();  // p1
        EXPECT_NO_THROW(mtx2.lock_shared());
        EXPECT_NO_THROW(mtx2.unlock_shared());
        step.await();  // p2
        EXPECT_NO_THROW(mtx1.unlock());
        break;
      case 1:
        ASSERT_NO_THROW(mtx2.try_lock());
        step.await();  // p1
        WAIT_TICKS;
        EXPECT_CHECK_FAILURE_INNER({
          mtx1.lock_shared();
        });
        EXPECT_NO_THROW(mtx2.unlock());
        step.await();  // p2
        break;
      }
    });
  };
  EXPECT_CHECK_FAILURE_OUTER(test_body());
}